

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_trinary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op,BaseType input_type)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  char (*pacVar5) [2];
  string local_220;
  string expr;
  string cast_op2;
  string cast_op1;
  string cast_op0;
  SPIRType expected_type;
  
  BVar1 = input_type;
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  SPIRType::SPIRType(&expected_type,pSVar3);
  expected_type.basetype = BVar1;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op0);
  if (pSVar4->basetype == BVar1) {
    to_unpacked_expression_abi_cxx11_(&cast_op0,this,op0,true);
  }
  else {
    bitcast_glsl_abi_cxx11_(&cast_op0,this,&expected_type,op0);
  }
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op1);
  if (pSVar4->basetype == BVar1) {
    to_unpacked_expression_abi_cxx11_(&cast_op1,this,op1,true);
  }
  else {
    bitcast_glsl_abi_cxx11_(&cast_op1,this,&expected_type,op1);
  }
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op2);
  if (pSVar4->basetype == BVar1) {
    pacVar5 = (char (*) [2])0x26da3b;
    to_unpacked_expression_abi_cxx11_(&cast_op2,this,op2,true);
  }
  else {
    pacVar5 = (char (*) [2])0x26da54;
    bitcast_glsl_abi_cxx11_(&cast_op2,this,&expected_type,op2);
  }
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  if (pSVar3->basetype == BVar1) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_220,(spirv_cross *)&op,(char **)0x3040b9,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300ad6,
               (char (*) [3])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300ad6,
               (char (*) [3])&cast_op2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30f9b8,pacVar5
              );
    ::std::__cxx11::string::_M_append((char *)&expr,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x3b])(&local_220,this,pSVar3,&expected_type);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    pacVar5 = (char (*) [2])0x26db36;
    ::std::__cxx11::string::push_back('\0');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_220,(spirv_cross *)&op,(char **)0x3040b9,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300ad6,
               (char (*) [3])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300ad6,
               (char (*) [3])&cast_op2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30f9b8,pacVar5
              );
    ::std::__cxx11::string::_M_append((char *)&expr,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back('\0');
  }
  bVar2 = should_forward(this,op0);
  if (bVar2) {
    bVar2 = should_forward(this,op1);
    if (bVar2) {
      bVar2 = should_forward(this,op2);
      goto LAB_0026dbe2;
    }
  }
  bVar2 = false;
LAB_0026dbe2:
  emit_op(this,result_type,result_id,&expr,bVar2,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
    operator_delete(expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_op2._M_dataplus._M_p != &cast_op2.field_2) {
    operator_delete(cast_op2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_op1._M_dataplus._M_p != &cast_op1.field_2) {
    operator_delete(cast_op1._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_op0._M_dataplus._M_p != &cast_op0.field_2) {
    operator_delete(cast_op0._M_dataplus._M_p);
  }
  expected_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003a2fa8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&expected_type.member_name_cache._M_h);
  expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &expected_type.member_type_index_redirection.stack_storage) {
    free(expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      != &expected_type.member_types.stack_storage) {
    free(expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
         ptr);
  }
  expected_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)expected_type.array_size_literal.super_VectorView<bool>.ptr !=
      &expected_type.array_size_literal.stack_storage) {
    free(expected_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  expected_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)expected_type.array.super_VectorView<unsigned_int>.ptr !=
      &expected_type.array.stack_storage) {
    free(expected_type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                             uint32_t op2, const char *op, SPIRType::BaseType input_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type;
	string cast_op0 =
	    expression_type(op0).basetype != input_type ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);
	string cast_op1 =
	    expression_type(op1).basetype != input_type ? bitcast_glsl(expected_type, op1) : to_unpacked_expression(op1);
	string cast_op2 =
	    expression_type(op2).basetype != input_type ? bitcast_glsl(expected_type, op2) : to_unpacked_expression(op2);

	string expr;
	if (out_type.basetype != input_type)
	{
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1) && should_forward(op2));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}